

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode setup_connection_internals(connectdata *conn)

{
  CURLcode CVar1;
  Curl_handler *pCStack_20;
  CURLcode result;
  Curl_handler *p;
  connectdata *conn_local;
  
  conn->socktype = 1;
  pCStack_20 = conn->handler;
  if (pCStack_20->setup_connection != (_func_CURLcode_connectdata_ptr *)0x0) {
    CVar1 = (*pCStack_20->setup_connection)(conn);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    pCStack_20 = conn->handler;
  }
  if (conn->port < 0) {
    conn->port = pCStack_20->defport;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_connection_internals(struct connectdata *conn)
{
  const struct Curl_handler * p;
  CURLcode result;
  conn->socktype = SOCK_STREAM; /* most of them are TCP streams */

  /* Perform setup complement if some. */
  p = conn->handler;

  if(p->setup_connection) {
    result = (*p->setup_connection)(conn);

    if(result)
      return result;

    p = conn->handler;              /* May have changed. */
  }

  if(conn->port < 0)
    /* we check for -1 here since if proxy was detected already, this
       was very likely already set to the proxy port */
    conn->port = p->defport;

  return CURLE_OK;
}